

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::assign
          (CImgDisplay *this,uint dimw,uint dimh,char *title,uint normalization_type,
          bool fullscreen_flag,bool closed_flag)

{
  X11_info *pXVar1;
  int in_EDX;
  int in_ESI;
  uint *in_RDI;
  undefined4 in_R8D;
  undefined1 in_R9B;
  undefined1 in_stack_00000008;
  bool in_stack_000001ea;
  bool in_stack_000001eb;
  uint in_stack_000001ec;
  char *in_stack_000001f0;
  uint in_stack_000001f8;
  uint in_stack_000001fc;
  CImgDisplay *in_stack_00000200;
  long lVar2;
  CImgDisplay *this_00;
  undefined2 in_stack_ffffffffffffffd8;
  CImgDisplay *local_8;
  
  if ((in_ESI == 0) || (in_EDX == 0)) {
    local_8 = assign((CImgDisplay *)
                     (CONCAT44(in_R8D,CONCAT13(in_R9B,CONCAT12(in_stack_00000008,
                                                               in_stack_ffffffffffffffd8))) &
                     0xffffffff0101ffff));
  }
  else {
    _assign(in_stack_00000200,in_stack_000001fc,in_stack_000001f8,in_stack_000001f0,
            in_stack_000001ec,in_stack_000001eb,in_stack_000001ea);
    in_RDI[0x128] = 0;
    in_RDI[0x127] = 0;
    this_00 = *(CImgDisplay **)(in_RDI + 0x13c);
    pXVar1 = cimg::X11_attr();
    if (pXVar1->nb_bits == 8) {
      lVar2 = 1;
    }
    else {
      pXVar1 = cimg::X11_attr();
      lVar2 = 4;
      if (pXVar1->nb_bits == 0x10) {
        lVar2 = 2;
      }
    }
    memset(this_00,0,lVar2 * (ulong)*in_RDI * (ulong)in_RDI[1]);
    local_8 = paint(this_00,SUB81((ulong)lVar2 >> 0x38,0));
  }
  return local_8;
}

Assistant:

CImgDisplay& assign(const unsigned int dimw, const unsigned int dimh, const char *const title=0,
                        const unsigned int normalization_type=3,
                        const bool fullscreen_flag=false, const bool closed_flag=false) {
      if (!dimw || !dimh) return assign();
      _assign(dimw,dimh,title,normalization_type,fullscreen_flag,closed_flag);
      _min = _max = 0;
      std::memset(_data,0,(cimg::X11_attr().nb_bits==8?sizeof(unsigned char):
                          (cimg::X11_attr().nb_bits==16?sizeof(unsigned short):sizeof(unsigned int)))*_width*_height);
      return paint();
    }